

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::ThreadData::start(ThreadData *this,size_t i_thread_index,size_t i_target_put_count,
                   size_t i_target_consume_count,uint64_t i_affinity_mask)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream thread_name;
  thread local_1c0 [4];
  anon_class_32_4_c8eb9a63_for__M_head_impl local_1a0 [11];
  
  local_1a0[0].this = (ThreadData *)this;
  local_1a0[0].i_target_put_count = i_target_put_count;
  local_1a0[0].i_target_consume_count = i_target_consume_count;
  local_1a0[0].i_affinity_mask = i_affinity_mask;
  std::thread::
  thread<density_tests::QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>::ThreadData::start(unsigned_long,unsigned_long,unsigned_long,unsigned_long)::_lambda()_1_,,void>
            (local_1c0,local_1a0);
  std::thread::operator=((thread *)(this + 0x18),local_1c0);
  std::thread::~thread(local_1c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::operator<<(poVar1,"_");
  pcVar2 = "producer_consumer";
  if (i_target_consume_count == 0) {
    pcVar2 = "producer";
  }
  pcVar3 = "consumer";
  if (i_target_put_count != 0) {
    pcVar3 = pcVar2;
  }
  std::operator<<((ostream *)local_1a0,pcVar3);
  std::__cxx11::stringbuf::str();
  set_thread_name((thread *)(this + 0x18),(char *)local_1c0[0]._M_id._M_thread);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void start(
              size_t   i_thread_index,
              size_t   i_target_put_count,
              size_t   i_target_consume_count,
              uint64_t i_affinity_mask)
            {
                m_thread = std::thread([=] {
                    thread_procedure(i_target_put_count, i_target_consume_count, i_affinity_mask);
                });

                // give a name to the thread
                std::ostringstream thread_name;
                thread_name << i_thread_index << "_";
                if (i_target_put_count == 0)
                    thread_name << "consumer";
                else if (i_target_consume_count == 0)
                    thread_name << "producer";
                else
                    thread_name << "producer_consumer";
                set_thread_name(m_thread, thread_name.str().c_str());
            }